

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::objectIndex
          (Interpreter *this,LocationRange *loc,HeapObject *obj,Identifier *f,uint offset)

{
  Stack *this_00;
  undefined8 uVar1;
  long lVar2;
  pointer ppVar3;
  pointer ppVar4;
  mapped_type *ppHVar5;
  key_type *in_RDI;
  BindingFrame binds;
  HeapThunk *th;
  iterator it_1;
  HeapComprehensionObject *comp;
  AST *body;
  const_iterator it;
  HeapSimpleObject *simp;
  HeapLeafObject *found;
  HeapObject *self;
  uint found_at;
  string *in_stack_fffffffffffffec8;
  LocationRange *in_stack_fffffffffffffed0;
  Interpreter *in_stack_fffffffffffffed8;
  HeapThunk *pHVar6;
  UString *in_stack_fffffffffffffee8;
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  *in_stack_ffffffffffffff10;
  uint *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  HeapObject *in_stack_ffffffffffffff58;
  Identifier *in_stack_ffffffffffffff60;
  Interpreter *in_stack_ffffffffffffff68;
  BindingFrame *in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffffa4;
  HeapObject *in_stack_ffffffffffffffa8;
  HeapEntity *in_stack_ffffffffffffffb0;
  LocationRange *in_stack_ffffffffffffffb8;
  Stack *this_01;
  pointer local_8;
  
  this_00 = (Stack *)findObject(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                                in_stack_ffffffffffffff58,
                                (uint)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                                in_stack_ffffffffffffff48);
  if (this_00 == (Stack *)0x0) {
    uVar1 = __cxa_allocate_exception(0x38);
    encode_utf8(in_stack_fffffffffffffee8);
    std::operator+((char *)in_stack_fffffffffffffed8,&in_stack_fffffffffffffed0->file);
    makeError(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    __cxa_throw(uVar1,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  if (this_00 == (Stack *)0x0) {
    lVar2 = 0;
  }
  else {
    lVar2 = __dynamic_cast(this_00,&(anonymous_namespace)::HeapLeafObject::typeinfo,
                           &(anonymous_namespace)::HeapSimpleObject::typeinfo,0);
  }
  if (lVar2 == 0) {
    this_01 = this_00;
    std::
    map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
    ::find((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
            *)in_stack_fffffffffffffec8,(key_type *)0x247600);
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                           *)0x247615);
    pHVar6 = ppVar4->second;
    std::
    map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
    ::map((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
           *)&stack0xffffffffffffff10,
          (map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
           *)in_stack_fffffffffffffec8);
    ppHVar5 = std::
              map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
              ::operator[](in_stack_ffffffffffffff10,in_RDI);
    *ppHVar5 = pHVar6;
    Stack::newCall(this_01,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                   in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98);
    local_8 = this_00[1].stack.
              super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    std::
    map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
    ::~map((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
            *)0x2476c0);
  }
  else {
    std::
    map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>_>_>
    ::find((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>_>_>
            *)in_stack_fffffffffffffec8,(key_type *)0x247567);
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>_>
                           *)0x24757c);
    local_8 = (pointer)(ppVar3->second).body;
    Stack::newCall(this_00,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                   in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98);
  }
  return (AST *)local_8;
}

Assistant:

const AST *objectIndex(const LocationRange &loc, HeapObject *obj, const Identifier *f,
                           unsigned offset)
    {
        unsigned found_at = 0;
        HeapObject *self = obj;
        HeapLeafObject *found = findObject(f, obj, offset, found_at);
        if (found == nullptr) {
            throw makeError(loc, "field does not exist: " + encode_utf8(f->name));
        }
        if (auto *simp = dynamic_cast<HeapSimpleObject *>(found)) {
            auto it = simp->fields.find(f);
            const AST *body = it->second.body;

            stack.newCall(loc, simp, self, found_at, simp->upValues);
            return body;
        } else {
            // If a HeapLeafObject is not HeapSimpleObject, it must be HeapComprehensionObject.
            auto *comp = static_cast<HeapComprehensionObject *>(found);
            auto it = comp->compValues.find(f);
            auto *th = it->second;
            BindingFrame binds = comp->upValues;
            binds[comp->id] = th;
            stack.newCall(loc, comp, self, found_at, binds);
            return comp->value;
        }
    }